

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

bool_t CallDelete(nodecontext *p,node *Node,nodeclass *Class)

{
  char cVar1;
  uintptr_t uVar2;
  thisnode p_00;
  bool_t bVar3;
  nodemeta *pnVar4;
  nodemeta *pnVar5;
  bool_t bVar6;
  nodedata *i;
  
  while( true ) {
    if (Class == (nodeclass *)0x0) {
      i = (nodedata *)&Node->Data;
      bVar6 = 1;
      while (i->Next != (nodedata *)0x0) {
        bVar3 = DataFree(p,Node,&i->Next,1);
        if (bVar3 == 0) {
          i = i->Next;
          bVar6 = 0;
        }
      }
      Node->VMT = (void *)0x0;
      return bVar6;
    }
    pnVar5 = Class->Meta;
    if (pnVar5 != (nodemeta *)0x0) break;
LAB_0011b8a8:
    Class = Class->ParentClass;
  }
  do {
    cVar1 = *(char *)pnVar5;
    if (cVar1 == '\x03') {
      (*(code *)pnVar5->Data)(Node,0);
    }
    else if (cVar1 == '\x0e') {
      (*(code *)pnVar5->Data)(Node);
    }
    else if (cVar1 == 'W') {
      uVar2 = pnVar5->Data;
      if ((-1 < (long)uVar2) &&
         (p_00 = *(thisnode *)((long)&Node->FourCC + uVar2), p_00 != (thisnode)0x0)) {
        pnVar4 = pnVar5;
        if (*(char *)(pnVar5 + 1) == '\x02') {
          pnVar4 = pnVar5 + 1;
        }
        pnVar5 = pnVar4;
        if (*(char *)(pnVar4 + 1) == '\x03') {
          pnVar5 = pnVar4 + 1;
          (*(code *)pnVar4[1].Data)(Node);
        }
        *(undefined8 *)((long)&Node->FourCC + uVar2) = 0;
        Node_Release(p_00);
      }
    }
    else if (cVar1 == '^') {
      uVar2 = pnVar5->Data;
      if (-1 < (long)uVar2) {
        pnVar4 = pnVar5;
        if (*(char *)(pnVar5 + 1) == '\x02') {
          pnVar4 = pnVar5 + 1;
        }
        pnVar5 = pnVar4;
        if (*(char *)(pnVar4 + 1) == '\x03') {
          pnVar5 = pnVar4 + 1;
          (*(code *)pnVar4[1].Data)(Node);
        }
        ArrayClear((array *)((long)&Node->FourCC + uVar2));
      }
    }
    else if (cVar1 == '\0') goto LAB_0011b8a8;
    pnVar5 = pnVar5 + 1;
  } while( true );
}

Assistant:

static NOINLINE bool_t CallDelete(nodecontext* p,node* Node,const nodeclass* Class)
{
    bool_t Result = 1;
    nodedata **ListItem;

    for (;Class;Class=Class->ParentClass)
        if (Class->Meta)
        {
            const nodemeta* m;
            for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
            {
                if (m->Meta == META_CLASS_DELETE)
                    ((void(*)(node*))m->Data)(Node);
                else
                if (m->Meta == META_PARAM_DATA_RELEASE)
                    ((nodeupdatefunc)m->Data)(Node,0);
                else
                if (m->Meta == (META_MODE_DATA | TYPE_ARRAY) && (intptr_t)m->Data>=0)
                {
                    array* Ptr = (void*)((uint8_t*)Node+m->Data);
#if defined(CONFIG_CORECDOC)
                    if (m[2].Meta == META_PARAM_DATA_FLAGS)
                    {
                        ++m;
                        ++m;
                    }
                    if (m[2].Meta == META_PARAM_DATA_RELEASE)
                    {
                        ++m;
                        ++m;
                        ((nodeupdatefunc)m->Data)(Node,0);
                    }
#else
                    if (m[1].Meta == META_PARAM_DATA_FLAGS)
                        ++m;
                    if (m[1].Meta == META_PARAM_DATA_RELEASE)
                    {
                        ++m;
                        ((nodeupdatefunc)m->Data)(Node,0);
                    }
#endif
                    ArrayClear(Ptr);
                }
                else
                if (m->Meta == (META_MODE_DATA | TYPE_NODE_REF) && (intptr_t)m->Data>=0)
                {
                    node** Ptr = (void*)((uint8_t*)Node+m->Data);
                    node* v = *Ptr;
                    if (v)
                    {
#if defined(CONFIG_CORECDOC)
                        if (m[2].Meta == META_PARAM_DATA_FLAGS)
                        {
                            ++m;
                            ++m;
                        }
                        if (m[2].Meta == META_PARAM_DATA_RELEASE)
                        {
                            ++m;
                            ++m;
                            ((nodeupdatefunc)m->Data)(Node,0);
                        }
#else
                        if (m[1].Meta == META_PARAM_DATA_FLAGS)
                            ++m;
                        if (m[1].Meta == META_PARAM_DATA_RELEASE)
                        {
                            ++m;
                            ((nodeupdatefunc)m->Data)(Node,0);
                        }
#endif
                        *Ptr = NULL;
                        Node_Release(v);
                    }
                }
            }
        }

    // no need to NodeLock around DataFree(), because object in deleting
    // (other threads should not touch this object anymore)
    ListItem = &Node->Data;
    while (*ListItem)
        if (!DataFree(p,Node,ListItem,1))
        {
            ListItem = &(*ListItem)->Next; // will be deleted on Node_NotifyInternal exit
            Result = 0;
        }

    Node->VMT = NULL;
    return Result;
}